

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# loop_dependence.cpp
# Opt level: O3

int64_t spvtools::opt::anon_unknown_15::GreatestCommonDivisor(int64_t a,int64_t b)

{
  ulong b_00;
  ulong uVar1;
  ulong uVar2;
  int64_t iVar3;
  long lVar4;
  
  if (a == b) {
    return a;
  }
  do {
    lVar4 = a % 2;
    uVar2 = b;
    while( true ) {
      if (a == 0) {
        return b;
      }
      if (uVar2 == 0) {
        return a;
      }
      b_00 = (long)uVar2 >> 1;
      if ((uVar2 & 1) == 0 && lVar4 == 0) {
        iVar3 = GreatestCommonDivisor(a / 2,b_00);
        return iVar3 * 2;
      }
      uVar1 = a;
      if ((uVar2 & 0x8000000000000001) == 1 && lVar4 == 0) goto LAB_002724b3;
      if ((lVar4 != 1) || ((uVar2 & 1) != 0)) break;
      uVar2 = b_00;
      if (a == b_00) {
        return a;
      }
    }
    uVar1 = a - uVar2;
    if (a - uVar2 == 0 || a < (long)uVar2) {
      uVar1 = uVar2 - a;
      uVar2 = a;
    }
LAB_002724b3:
    a = (long)uVar1 / 2;
    b = uVar2;
    if (a == uVar2) {
      return uVar2;
    }
  } while( true );
}

Assistant:

int64_t GreatestCommonDivisor(int64_t a, int64_t b) {
  // Simple cases
  if (a == b) {
    return a;
  } else if (a == 0) {
    return b;
  } else if (b == 0) {
    return a;
  }

  // Both even
  if (a % 2 == 0 && b % 2 == 0) {
    return 2 * GreatestCommonDivisor(a / 2, b / 2);
  }

  // Even a, odd b
  if (a % 2 == 0 && b % 2 == 1) {
    return GreatestCommonDivisor(a / 2, b);
  }

  // Odd a, even b
  if (a % 2 == 1 && b % 2 == 0) {
    return GreatestCommonDivisor(a, b / 2);
  }

  // Both odd, reduce the larger argument
  if (a > b) {
    return GreatestCommonDivisor((a - b) / 2, b);
  } else {
    return GreatestCommonDivisor((b - a) / 2, a);
  }
}